

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O3

QVariant * qTimeFromString(QVariant *__return_storage_ptr__,QString *val)

{
  QVariant *pQVar1;
  QTime QVar2;
  long in_RDX;
  QStringView QVar3;
  
  if (in_RDX == 0) {
    QVar2.mds = -1;
  }
  else {
    QVar3.m_data = (storage_type_conflict *)val;
    QVar3.m_size = in_RDX;
    QVar2.mds = QTime::fromString(QVar3,ISODate);
  }
  pQVar1 = (QVariant *)QVariant::QVariant(__return_storage_ptr__,QVar2);
  return pQVar1;
}

Assistant:

static inline QVariant qTimeFromString(const QString &val)
{
#if !QT_CONFIG(datestring)
    Q_UNUSED(val);
    return QVariant(val);
#else
    if (val.isEmpty())
        return QVariant(QTime());
    return QVariant(QTime::fromString(val, Qt::ISODate));
#endif
}